

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O3

void idct64_low8_avx2(__m256i *input,__m256i *output)

{
  undefined1 auVar1 [32];
  __m256i alVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  
  auVar41._8_4_ = 0x191f014;
  auVar41._0_8_ = 0x191f0140191f014;
  auVar41._12_4_ = 0x191f014;
  auVar41._16_4_ = 0x191f014;
  auVar41._20_4_ = 0x191f014;
  auVar41._24_4_ = 0x191f014;
  auVar41._28_4_ = 0x191f014;
  auVar74._8_2_ = 0x328;
  auVar74._0_8_ = 0x328032803280328;
  auVar74._10_2_ = 0x328;
  auVar74._12_2_ = 0x328;
  auVar74._14_2_ = 0x328;
  auVar74._16_2_ = 0x328;
  auVar74._18_2_ = 0x328;
  auVar74._20_2_ = 0x328;
  auVar74._22_2_ = 0x328;
  auVar74._24_2_ = 0x328;
  auVar74._26_2_ = 0x328;
  auVar74._28_2_ = 0x328;
  auVar74._30_2_ = 0x328;
  auVar40._8_2_ = 0x7ff8;
  auVar40._0_8_ = 0x7ff87ff87ff87ff8;
  auVar40._10_2_ = 0x7ff8;
  auVar40._12_2_ = 0x7ff8;
  auVar40._14_2_ = 0x7ff8;
  auVar40._16_2_ = 0x7ff8;
  auVar40._18_2_ = 0x7ff8;
  auVar40._20_2_ = 0x7ff8;
  auVar40._22_2_ = 0x7ff8;
  auVar40._24_2_ = 0x7ff8;
  auVar40._26_2_ = 0x7ff8;
  auVar40._28_2_ = 0x7ff8;
  auVar40._30_2_ = 0x7ff8;
  auVar3 = vpmulhrsw_avx2((undefined1  [32])input[1],auVar74);
  auVar4 = vpmulhrsw_avx2((undefined1  [32])input[1],auVar40);
  auVar71._8_2_ = 0xea20;
  auVar71._0_8_ = 0xea20ea20ea20ea20;
  auVar71._10_2_ = 0xea20;
  auVar71._12_2_ = 0xea20;
  auVar71._14_2_ = 0xea20;
  auVar71._16_2_ = 0xea20;
  auVar71._18_2_ = 0xea20;
  auVar71._20_2_ = 0xea20;
  auVar71._22_2_ = 0xea20;
  auVar71._24_2_ = 0xea20;
  auVar71._26_2_ = 0xea20;
  auVar71._28_2_ = 0xea20;
  auVar71._30_2_ = 0xea20;
  auVar65._8_2_ = 0x7e20;
  auVar65._0_8_ = 0x7e207e207e207e20;
  auVar65._10_2_ = 0x7e20;
  auVar65._12_2_ = 0x7e20;
  auVar65._14_2_ = 0x7e20;
  auVar65._16_2_ = 0x7e20;
  auVar65._18_2_ = 0x7e20;
  auVar65._20_2_ = 0x7e20;
  auVar65._22_2_ = 0x7e20;
  auVar65._24_2_ = 0x7e20;
  auVar65._26_2_ = 0x7e20;
  auVar65._28_2_ = 0x7e20;
  auVar65._30_2_ = 0x7e20;
  auVar5 = vpmulhrsw_avx2((undefined1  [32])input[7],auVar71);
  auVar6 = vpmulhrsw_avx2((undefined1  [32])input[7],auVar65);
  auVar38._8_2_ = 0xfa8;
  auVar38._0_8_ = 0xfa80fa80fa80fa8;
  auVar38._10_2_ = 0xfa8;
  auVar38._12_2_ = 0xfa8;
  auVar38._14_2_ = 0xfa8;
  auVar38._16_2_ = 0xfa8;
  auVar38._18_2_ = 0xfa8;
  auVar38._20_2_ = 0xfa8;
  auVar38._22_2_ = 0xfa8;
  auVar38._24_2_ = 0xfa8;
  auVar38._26_2_ = 0xfa8;
  auVar38._28_2_ = 0xfa8;
  auVar38._30_2_ = 0xfa8;
  auVar70._8_2_ = 0x7f08;
  auVar70._0_8_ = 0x7f087f087f087f08;
  auVar70._10_2_ = 0x7f08;
  auVar70._12_2_ = 0x7f08;
  auVar70._14_2_ = 0x7f08;
  auVar70._16_2_ = 0x7f08;
  auVar70._18_2_ = 0x7f08;
  auVar70._20_2_ = 0x7f08;
  auVar70._22_2_ = 0x7f08;
  auVar70._24_2_ = 0x7f08;
  auVar70._26_2_ = 0x7f08;
  auVar70._28_2_ = 0x7f08;
  auVar70._30_2_ = 0x7f08;
  auVar7 = vpmulhrsw_avx2((undefined1  [32])input[5],auVar38);
  auVar8 = vpmulhrsw_avx2((undefined1  [32])input[5],auVar70);
  auVar77._8_2_ = 0xf698;
  auVar77._0_8_ = 0xf698f698f698f698;
  auVar77._10_2_ = 0xf698;
  auVar77._12_2_ = 0xf698;
  auVar77._14_2_ = 0xf698;
  auVar77._16_2_ = 0xf698;
  auVar77._18_2_ = 0xf698;
  auVar77._20_2_ = 0xf698;
  auVar77._22_2_ = 0xf698;
  auVar77._24_2_ = 0xf698;
  auVar77._26_2_ = 0xf698;
  auVar77._28_2_ = 0xf698;
  auVar77._30_2_ = 0xf698;
  auVar39._8_2_ = 0x7fa8;
  auVar39._0_8_ = 0x7fa87fa87fa87fa8;
  auVar39._10_2_ = 0x7fa8;
  auVar39._12_2_ = 0x7fa8;
  auVar39._14_2_ = 0x7fa8;
  auVar39._16_2_ = 0x7fa8;
  auVar39._18_2_ = 0x7fa8;
  auVar39._20_2_ = 0x7fa8;
  auVar39._22_2_ = 0x7fa8;
  auVar39._24_2_ = 0x7fa8;
  auVar39._26_2_ = 0x7fa8;
  auVar39._28_2_ = 0x7fa8;
  auVar39._30_2_ = 0x7fa8;
  auVar9 = vpmulhrsw_avx2((undefined1  [32])input[3],auVar77);
  auVar10 = vpmulhrsw_avx2((undefined1  [32])input[3],auVar39);
  auVar51._8_2_ = 0x648;
  auVar51._0_8_ = 0x648064806480648;
  auVar51._10_2_ = 0x648;
  auVar51._12_2_ = 0x648;
  auVar51._14_2_ = 0x648;
  auVar51._16_2_ = 0x648;
  auVar51._18_2_ = 0x648;
  auVar51._20_2_ = 0x648;
  auVar51._22_2_ = 0x648;
  auVar51._24_2_ = 0x648;
  auVar51._26_2_ = 0x648;
  auVar51._28_2_ = 0x648;
  auVar51._30_2_ = 0x648;
  auVar78._8_2_ = 0x7fd8;
  auVar78._0_8_ = 0x7fd87fd87fd87fd8;
  auVar78._10_2_ = 0x7fd8;
  auVar78._12_2_ = 0x7fd8;
  auVar78._14_2_ = 0x7fd8;
  auVar78._16_2_ = 0x7fd8;
  auVar78._18_2_ = 0x7fd8;
  auVar78._20_2_ = 0x7fd8;
  auVar78._22_2_ = 0x7fd8;
  auVar78._24_2_ = 0x7fd8;
  auVar78._26_2_ = 0x7fd8;
  auVar78._28_2_ = 0x7fd8;
  auVar78._30_2_ = 0x7fd8;
  auVar11 = vpmulhrsw_avx2((undefined1  [32])input[2],auVar51);
  auVar12 = vpmulhrsw_avx2((undefined1  [32])input[2],auVar78);
  auVar48._8_2_ = 0xed38;
  auVar48._0_8_ = 0xed38ed38ed38ed38;
  auVar48._10_2_ = 0xed38;
  auVar48._12_2_ = 0xed38;
  auVar48._14_2_ = 0xed38;
  auVar48._16_2_ = 0xed38;
  auVar48._18_2_ = 0xed38;
  auVar48._20_2_ = 0xed38;
  auVar48._22_2_ = 0xed38;
  auVar48._24_2_ = 0xed38;
  auVar48._26_2_ = 0xed38;
  auVar48._28_2_ = 0xed38;
  auVar48._30_2_ = 0xed38;
  auVar53._8_2_ = 0x7ea0;
  auVar53._0_8_ = 0x7ea07ea07ea07ea0;
  auVar53._10_2_ = 0x7ea0;
  auVar53._12_2_ = 0x7ea0;
  auVar53._14_2_ = 0x7ea0;
  auVar53._16_2_ = 0x7ea0;
  auVar53._18_2_ = 0x7ea0;
  auVar53._20_2_ = 0x7ea0;
  auVar53._22_2_ = 0x7ea0;
  auVar53._24_2_ = 0x7ea0;
  auVar53._26_2_ = 0x7ea0;
  auVar53._28_2_ = 0x7ea0;
  auVar53._30_2_ = 0x7ea0;
  auVar13 = vpmulhrsw_avx2((undefined1  [32])input[6],auVar48);
  auVar14 = vpmulhrsw_avx2((undefined1  [32])input[6],auVar53);
  auVar36._8_2_ = 0xc88;
  auVar36._0_8_ = 0xc880c880c880c88;
  auVar36._10_2_ = 0xc88;
  auVar36._12_2_ = 0xc88;
  auVar36._14_2_ = 0xc88;
  auVar36._16_2_ = 0xc88;
  auVar36._18_2_ = 0xc88;
  auVar36._20_2_ = 0xc88;
  auVar36._22_2_ = 0xc88;
  auVar36._24_2_ = 0xc88;
  auVar36._26_2_ = 0xc88;
  auVar36._28_2_ = 0xc88;
  auVar36._30_2_ = 0xc88;
  auVar50._8_2_ = 0x7f60;
  auVar50._0_8_ = 0x7f607f607f607f60;
  auVar50._10_2_ = 0x7f60;
  auVar50._12_2_ = 0x7f60;
  auVar50._14_2_ = 0x7f60;
  auVar50._16_2_ = 0x7f60;
  auVar50._18_2_ = 0x7f60;
  auVar50._20_2_ = 0x7f60;
  auVar50._22_2_ = 0x7f60;
  auVar50._24_2_ = 0x7f60;
  auVar50._26_2_ = 0x7f60;
  auVar50._28_2_ = 0x7f60;
  auVar50._30_2_ = 0x7f60;
  auVar15 = vpmulhrsw_avx2((undefined1  [32])input[4],auVar36);
  auVar16 = vpmulhrsw_avx2((undefined1  [32])input[4],auVar50);
  auVar70 = vpunpcklwd_avx2(auVar3,auVar4);
  auVar71 = vpunpckhwd_avx2(auVar3,auVar4);
  auVar36 = vpmaddwd_avx2(auVar70,auVar41);
  auVar41 = vpmaddwd_avx2(auVar71,auVar41);
  auVar35._8_4_ = 0x800;
  auVar35._0_8_ = 0x80000000800;
  auVar35._12_4_ = 0x800;
  auVar35._16_4_ = 0x800;
  auVar35._20_4_ = 0x800;
  auVar35._24_4_ = 0x800;
  auVar35._28_4_ = 0x800;
  auVar36 = vpaddd_avx2(auVar36,auVar35);
  auVar41 = vpaddd_avx2(auVar41,auVar35);
  auVar36 = vpsrad_avx2(auVar36,0xc);
  auVar41 = vpsrad_avx2(auVar41,0xc);
  auVar36 = vpackssdw_avx2(auVar36,auVar41);
  auVar37._8_4_ = 0xfec0191;
  auVar37._0_8_ = 0xfec01910fec0191;
  auVar37._12_4_ = 0xfec0191;
  auVar37._16_4_ = 0xfec0191;
  auVar37._20_4_ = 0xfec0191;
  auVar37._24_4_ = 0xfec0191;
  auVar37._28_4_ = 0xfec0191;
  auVar41 = vpmaddwd_avx2(auVar70,auVar37);
  auVar37 = vpmaddwd_avx2(auVar71,auVar37);
  auVar41 = vpaddd_avx2(auVar41,auVar35);
  auVar37 = vpaddd_avx2(auVar37,auVar35);
  auVar42 = vpsrad_avx2(auVar41,0xc);
  auVar41 = vpsrad_avx2(auVar37,0xc);
  auVar41 = vpackssdw_avx2(auVar42,auVar41);
  auVar42._8_4_ = 0xf5daf3a2;
  auVar42._0_8_ = 0xf5daf3a2f5daf3a2;
  auVar42._12_4_ = 0xf5daf3a2;
  auVar42._16_4_ = 0xf5daf3a2;
  auVar42._20_4_ = 0xf5daf3a2;
  auVar42._24_4_ = 0xf5daf3a2;
  auVar42._28_4_ = 0xf5daf3a2;
  auVar40 = vpunpcklwd_avx2(auVar5,auVar6);
  auVar65 = vpunpckhwd_avx2(auVar5,auVar6);
  auVar37 = vpmaddwd_avx2(auVar40,auVar42);
  auVar42 = vpmaddwd_avx2(auVar65,auVar42);
  auVar37 = vpaddd_avx2(auVar37,auVar35);
  auVar42 = vpaddd_avx2(auVar42,auVar35);
  auVar43 = vpsrad_avx2(auVar37,0xc);
  auVar37 = vpsrad_avx2(auVar42,0xc);
  auVar37 = vpackssdw_avx2(auVar43,auVar37);
  auVar43._8_4_ = 0xc5ef5da;
  auVar43._0_8_ = 0xc5ef5da0c5ef5da;
  auVar43._12_4_ = 0xc5ef5da;
  auVar43._16_4_ = 0xc5ef5da;
  auVar43._20_4_ = 0xc5ef5da;
  auVar43._24_4_ = 0xc5ef5da;
  auVar43._28_4_ = 0xc5ef5da;
  auVar42 = vpmaddwd_avx2(auVar40,auVar43);
  auVar43 = vpmaddwd_avx2(auVar65,auVar43);
  auVar42 = vpaddd_avx2(auVar42,auVar35);
  auVar43 = vpaddd_avx2(auVar43,auVar35);
  auVar44 = vpsrad_avx2(auVar42,0xc);
  auVar42 = vpsrad_avx2(auVar43,0xc);
  auVar42 = vpackssdw_avx2(auVar44,auVar42);
  auVar44._8_4_ = 0x78bf1e4;
  auVar44._0_8_ = 0x78bf1e4078bf1e4;
  auVar44._12_4_ = 0x78bf1e4;
  auVar44._16_4_ = 0x78bf1e4;
  auVar44._20_4_ = 0x78bf1e4;
  auVar44._24_4_ = 0x78bf1e4;
  auVar44._28_4_ = 0x78bf1e4;
  auVar52 = vpunpcklwd_avx2(auVar7,auVar8);
  auVar68 = vpunpckhwd_avx2(auVar7,auVar8);
  auVar43 = vpmaddwd_avx2(auVar52,auVar44);
  auVar44 = vpmaddwd_avx2(auVar68,auVar44);
  auVar43 = vpaddd_avx2(auVar43,auVar35);
  auVar44 = vpaddd_avx2(auVar44,auVar35);
  auVar45 = vpsrad_avx2(auVar43,0xc);
  auVar43 = vpsrad_avx2(auVar44,0xc);
  auVar43 = vpackssdw_avx2(auVar45,auVar43);
  auVar45._8_4_ = 0xe1c078b;
  auVar45._0_8_ = 0xe1c078b0e1c078b;
  auVar45._12_4_ = 0xe1c078b;
  auVar45._16_4_ = 0xe1c078b;
  auVar45._20_4_ = 0xe1c078b;
  auVar45._24_4_ = 0xe1c078b;
  auVar45._28_4_ = 0xe1c078b;
  auVar44 = vpmaddwd_avx2(auVar52,auVar45);
  auVar45 = vpmaddwd_avx2(auVar68,auVar45);
  auVar44 = vpaddd_avx2(auVar44,auVar35);
  auVar45 = vpaddd_avx2(auVar45,auVar35);
  auVar46 = vpsrad_avx2(auVar44,0xc);
  auVar44 = vpsrad_avx2(auVar45,0xc);
  auVar44 = vpackssdw_avx2(auVar46,auVar44);
  auVar46._8_4_ = 0xfb5bf0b0;
  auVar46._0_8_ = 0xfb5bf0b0fb5bf0b0;
  auVar46._12_4_ = 0xfb5bf0b0;
  auVar46._16_4_ = 0xfb5bf0b0;
  auVar46._20_4_ = 0xfb5bf0b0;
  auVar46._24_4_ = 0xfb5bf0b0;
  auVar46._28_4_ = 0xfb5bf0b0;
  auVar55 = vpunpcklwd_avx2(auVar9,auVar10);
  auVar58 = vpunpckhwd_avx2(auVar9,auVar10);
  auVar45 = vpmaddwd_avx2(auVar55,auVar46);
  auVar46 = vpmaddwd_avx2(auVar58,auVar46);
  auVar45 = vpaddd_avx2(auVar45,auVar35);
  auVar46 = vpaddd_avx2(auVar46,auVar35);
  auVar47 = vpsrad_avx2(auVar45,0xc);
  auVar45 = vpsrad_avx2(auVar46,0xc);
  auVar45 = vpackssdw_avx2(auVar47,auVar45);
  auVar47._8_4_ = 0xf50fb5b;
  auVar47._0_8_ = 0xf50fb5b0f50fb5b;
  auVar47._12_4_ = 0xf50fb5b;
  auVar47._16_4_ = 0xf50fb5b;
  auVar47._20_4_ = 0xf50fb5b;
  auVar47._24_4_ = 0xf50fb5b;
  auVar47._28_4_ = 0xf50fb5b;
  auVar46 = vpmaddwd_avx2(auVar55,auVar47);
  auVar47 = vpmaddwd_avx2(auVar58,auVar47);
  auVar46 = vpaddd_avx2(auVar46,auVar35);
  auVar47 = vpaddd_avx2(auVar47,auVar35);
  auVar48 = vpsrad_avx2(auVar46,0xc);
  auVar46 = vpsrad_avx2(auVar47,0xc);
  auVar46 = vpackssdw_avx2(auVar48,auVar46);
  auVar57._8_4_ = 0x31ff04f;
  auVar57._0_8_ = 0x31ff04f031ff04f;
  auVar57._12_4_ = 0x31ff04f;
  auVar57._16_4_ = 0x31ff04f;
  auVar57._20_4_ = 0x31ff04f;
  auVar57._24_4_ = 0x31ff04f;
  auVar57._28_4_ = 0x31ff04f;
  auVar63 = vpunpcklwd_avx2(auVar11,auVar12);
  auVar47 = vpmaddwd_avx2(auVar63,auVar57);
  auVar47 = vpaddd_avx2(auVar47,auVar35);
  auVar62 = vpunpckhwd_avx2(auVar11,auVar12);
  auVar48 = vpmaddwd_avx2(auVar62,auVar57);
  auVar48 = vpaddd_avx2(auVar48,auVar35);
  auVar47 = vpsrad_avx2(auVar47,0xc);
  auVar48 = vpsrad_avx2(auVar48,0xc);
  auVar47 = vpackssdw_avx2(auVar47,auVar48);
  auVar67._8_4_ = 0xfb1031f;
  auVar67._0_8_ = 0xfb1031f0fb1031f;
  auVar67._12_4_ = 0xfb1031f;
  auVar67._16_4_ = 0xfb1031f;
  auVar67._20_4_ = 0xfb1031f;
  auVar67._24_4_ = 0xfb1031f;
  auVar67._28_4_ = 0xfb1031f;
  auVar48 = vpmaddwd_avx2(auVar63,auVar67);
  auVar48 = vpaddd_avx2(auVar48,auVar35);
  auVar50 = vpmaddwd_avx2(auVar62,auVar67);
  auVar50 = vpaddd_avx2(auVar50,auVar35);
  auVar48 = vpsrad_avx2(auVar48,0xc);
  auVar50 = vpsrad_avx2(auVar50,0xc);
  auVar48 = vpackssdw_avx2(auVar48,auVar50);
  auVar61._8_4_ = 0xf71cf2b2;
  auVar61._0_8_ = 0xf71cf2b2f71cf2b2;
  auVar61._12_4_ = 0xf71cf2b2;
  auVar61._16_4_ = 0xf71cf2b2;
  auVar61._20_4_ = 0xf71cf2b2;
  auVar61._24_4_ = 0xf71cf2b2;
  auVar61._28_4_ = 0xf71cf2b2;
  auVar72 = vpunpcklwd_avx2(auVar13,auVar14);
  auVar50 = vpmaddwd_avx2(auVar61,auVar72);
  auVar50 = vpaddd_avx2(auVar50,auVar35);
  auVar64 = vpunpckhwd_avx2(auVar13,auVar14);
  auVar51 = vpmaddwd_avx2(auVar61,auVar64);
  auVar51 = vpaddd_avx2(auVar51,auVar35);
  auVar50 = vpsrad_avx2(auVar50,0xc);
  auVar51 = vpsrad_avx2(auVar51,0xc);
  auVar50 = vpackssdw_avx2(auVar50,auVar51);
  auVar60._8_4_ = 0xd4ef71c;
  auVar60._0_8_ = 0xd4ef71c0d4ef71c;
  auVar60._12_4_ = 0xd4ef71c;
  auVar60._16_4_ = 0xd4ef71c;
  auVar60._20_4_ = 0xd4ef71c;
  auVar60._24_4_ = 0xd4ef71c;
  auVar60._28_4_ = 0xd4ef71c;
  auVar51 = vpmaddwd_avx2(auVar72,auVar60);
  auVar51 = vpaddd_avx2(auVar51,auVar35);
  auVar53 = vpmaddwd_avx2(auVar64,auVar60);
  auVar53 = vpaddd_avx2(auVar53,auVar35);
  auVar51 = vpsrad_avx2(auVar51,0xc);
  auVar53 = vpsrad_avx2(auVar53,0xc);
  auVar51 = vpackssdw_avx2(auVar51,auVar53);
  auVar76._8_4_ = 0x61ff138;
  auVar76._0_8_ = 0x61ff138061ff138;
  auVar76._12_4_ = 0x61ff138;
  auVar76._16_4_ = 0x61ff138;
  auVar76._20_4_ = 0x61ff138;
  auVar76._24_4_ = 0x61ff138;
  auVar76._28_4_ = 0x61ff138;
  auVar33 = vpunpcklwd_avx2(auVar15,auVar16);
  auVar53 = vpmaddwd_avx2(auVar33,auVar76);
  auVar53 = vpaddd_avx2(auVar53,auVar35);
  auVar32 = vpunpckhwd_avx2(auVar15,auVar16);
  auVar77 = vpmaddwd_avx2(auVar76,auVar32);
  auVar77 = vpaddd_avx2(auVar77,auVar35);
  auVar53 = vpsrad_avx2(auVar53,0xc);
  auVar77 = vpsrad_avx2(auVar77,0xc);
  auVar53 = vpackssdw_avx2(auVar53,auVar77);
  auVar54._8_4_ = 0xec8061f;
  auVar54._0_8_ = 0xec8061f0ec8061f;
  auVar54._12_4_ = 0xec8061f;
  auVar54._16_4_ = 0xec8061f;
  auVar54._20_4_ = 0xec8061f;
  auVar54._24_4_ = 0xec8061f;
  auVar54._28_4_ = 0xec8061f;
  auVar77 = vpmaddwd_avx2(auVar33,auVar54);
  auVar77 = vpaddd_avx2(auVar77,auVar35);
  auVar78 = vpmaddwd_avx2(auVar32,auVar54);
  auVar78 = vpaddd_avx2(auVar78,auVar35);
  auVar77 = vpsrad_avx2(auVar77,0xc);
  auVar78 = vpsrad_avx2(auVar78,0xc);
  auVar77 = vpackssdw_avx2(auVar77,auVar78);
  auVar74 = vpunpcklwd_avx2(auVar36,auVar41);
  auVar78 = vpmaddwd_avx2(auVar74,auVar57);
  auVar78 = vpaddd_avx2(auVar78,auVar35);
  auVar39 = vpunpckhwd_avx2(auVar36,auVar41);
  auVar38 = vpmaddwd_avx2(auVar39,auVar57);
  auVar38 = vpaddd_avx2(auVar38,auVar35);
  auVar79 = vpsrad_avx2(auVar78,0xc);
  auVar78 = vpsrad_avx2(auVar38,0xc);
  auVar78 = vpackssdw_avx2(auVar79,auVar78);
  auVar38 = vpmaddwd_avx2(auVar74,auVar67);
  auVar39 = vpmaddwd_avx2(auVar39,auVar67);
  auVar38 = vpaddd_avx2(auVar38,auVar35);
  auVar39 = vpaddd_avx2(auVar39,auVar35);
  auVar74 = vpsrad_avx2(auVar38,0xc);
  auVar38 = vpsrad_avx2(auVar39,0xc);
  auVar38 = vpackssdw_avx2(auVar74,auVar38);
  auVar39 = vpmaddwd_avx2(auVar70,auVar57);
  auVar70 = vpmaddwd_avx2(auVar70,auVar67);
  auVar74 = vpmaddwd_avx2(auVar71,auVar67);
  auVar71 = vpmaddwd_avx2(auVar71,auVar57);
  auVar39 = vpaddd_avx2(auVar39,auVar35);
  auVar71 = vpaddd_avx2(auVar71,auVar35);
  auVar39 = vpsrad_avx2(auVar39,0xc);
  auVar71 = vpsrad_avx2(auVar71,0xc);
  auVar39 = vpackssdw_avx2(auVar39,auVar71);
  auVar71 = vpaddd_avx2(auVar70,auVar35);
  auVar70 = vpaddd_avx2(auVar74,auVar35);
  auVar71 = vpsrad_avx2(auVar71,0xc);
  auVar70 = vpsrad_avx2(auVar70,0xc);
  auVar71 = vpackssdw_avx2(auVar71,auVar70);
  auVar66._8_4_ = 0xf04ffce1;
  auVar66._0_8_ = 0xf04ffce1f04ffce1;
  auVar66._12_4_ = 0xf04ffce1;
  auVar66._16_4_ = 0xf04ffce1;
  auVar66._20_4_ = 0xf04ffce1;
  auVar66._24_4_ = 0xf04ffce1;
  auVar66._28_4_ = 0xf04ffce1;
  auVar70 = vpmaddwd_avx2(auVar40,auVar66);
  auVar70 = vpaddd_avx2(auVar70,auVar35);
  auVar74 = vpmaddwd_avx2(auVar65,auVar66);
  auVar74 = vpaddd_avx2(auVar74,auVar35);
  auVar70 = vpsrad_avx2(auVar70,0xc);
  auVar74 = vpsrad_avx2(auVar74,0xc);
  auVar70 = vpackssdw_avx2(auVar70,auVar74);
  auVar74 = vpmaddwd_avx2(auVar40,auVar57);
  auVar65 = vpmaddwd_avx2(auVar65,auVar57);
  auVar74 = vpaddd_avx2(auVar74,auVar35);
  auVar65 = vpaddd_avx2(auVar65,auVar35);
  auVar74 = vpsrad_avx2(auVar74,0xc);
  auVar65 = vpsrad_avx2(auVar65,0xc);
  auVar74 = vpackssdw_avx2(auVar74,auVar65);
  auVar79 = vpunpcklwd_avx2(auVar37,auVar42);
  auVar67 = vpunpckhwd_avx2(auVar37,auVar42);
  auVar65 = vpmaddwd_avx2(auVar79,auVar66);
  auVar40 = vpmaddwd_avx2(auVar67,auVar66);
  auVar79 = vpmaddwd_avx2(auVar79,auVar57);
  auVar67 = vpmaddwd_avx2(auVar67,auVar57);
  auVar65 = vpaddd_avx2(auVar65,auVar35);
  auVar40 = vpaddd_avx2(auVar40,auVar35);
  auVar66 = vpsrad_avx2(auVar65,0xc);
  auVar65 = vpsrad_avx2(auVar40,0xc);
  auVar65 = vpackssdw_avx2(auVar66,auVar65);
  auVar40 = vpaddd_avx2(auVar79,auVar35);
  auVar79 = vpaddd_avx2(auVar67,auVar35);
  auVar40 = vpsrad_avx2(auVar40,0xc);
  auVar79 = vpsrad_avx2(auVar79,0xc);
  auVar40 = vpackssdw_avx2(auVar40,auVar79);
  auVar57 = vpunpcklwd_avx2(auVar43,auVar44);
  auVar79 = vpmaddwd_avx2(auVar57,auVar60);
  auVar79 = vpaddd_avx2(auVar79,auVar35);
  auVar66 = vpunpckhwd_avx2(auVar43,auVar44);
  auVar67 = vpmaddwd_avx2(auVar66,auVar60);
  auVar67 = vpaddd_avx2(auVar67,auVar35);
  auVar79 = vpsrad_avx2(auVar79,0xc);
  auVar67 = vpsrad_avx2(auVar67,0xc);
  auVar79 = vpackssdw_avx2(auVar79,auVar67);
  auVar59._8_4_ = 0x8e40d4e;
  auVar59._0_8_ = 0x8e40d4e08e40d4e;
  auVar59._12_4_ = 0x8e40d4e;
  auVar59._16_4_ = 0x8e40d4e;
  auVar59._20_4_ = 0x8e40d4e;
  auVar59._24_4_ = 0x8e40d4e;
  auVar59._28_4_ = 0x8e40d4e;
  auVar67 = vpmaddwd_avx2(auVar57,auVar59);
  auVar66 = vpmaddwd_avx2(auVar66,auVar59);
  auVar67 = vpaddd_avx2(auVar67,auVar35);
  auVar66 = vpaddd_avx2(auVar66,auVar35);
  auVar67 = vpsrad_avx2(auVar67,0xc);
  auVar66 = vpsrad_avx2(auVar66,0xc);
  auVar67 = vpackssdw_avx2(auVar67,auVar66);
  auVar66 = vpmaddwd_avx2(auVar52,auVar60);
  auVar52 = vpmaddwd_avx2(auVar52,auVar59);
  auVar57 = vpmaddwd_avx2(auVar68,auVar59);
  auVar68 = vpmaddwd_avx2(auVar68,auVar60);
  auVar66 = vpaddd_avx2(auVar66,auVar35);
  auVar68 = vpaddd_avx2(auVar68,auVar35);
  auVar66 = vpsrad_avx2(auVar66,0xc);
  auVar68 = vpsrad_avx2(auVar68,0xc);
  auVar66 = vpackssdw_avx2(auVar66,auVar68);
  auVar68 = vpaddd_avx2(auVar52,auVar35);
  auVar52 = vpaddd_avx2(auVar57,auVar35);
  auVar57 = vpsrad_avx2(auVar68,0xc);
  auVar68 = vpsrad_avx2(auVar52,0xc);
  auVar68 = vpackssdw_avx2(auVar57,auVar68);
  auVar52 = vpmaddwd_avx2(auVar61,auVar55);
  auVar52 = vpaddd_avx2(auVar52,auVar35);
  auVar57 = vpmaddwd_avx2(auVar61,auVar58);
  auVar57 = vpaddd_avx2(auVar57,auVar35);
  auVar52 = vpsrad_avx2(auVar52,0xc);
  auVar57 = vpsrad_avx2(auVar57,0xc);
  auVar52 = vpackssdw_avx2(auVar52,auVar57);
  auVar57 = vpmaddwd_avx2(auVar55,auVar60);
  auVar58 = vpmaddwd_avx2(auVar58,auVar60);
  auVar57 = vpaddd_avx2(auVar57,auVar35);
  auVar58 = vpaddd_avx2(auVar58,auVar35);
  auVar57 = vpsrad_avx2(auVar57,0xc);
  auVar58 = vpsrad_avx2(auVar58,0xc);
  auVar57 = vpackssdw_avx2(auVar57,auVar58);
  auVar59 = vpunpcklwd_avx2(auVar45,auVar46);
  auVar56 = vpunpckhwd_avx2(auVar45,auVar46);
  auVar58 = vpmaddwd_avx2(auVar61,auVar59);
  auVar55 = vpmaddwd_avx2(auVar61,auVar56);
  auVar59 = vpmaddwd_avx2(auVar59,auVar60);
  auVar56 = vpmaddwd_avx2(auVar56,auVar60);
  auVar58 = vpaddd_avx2(auVar58,auVar35);
  auVar55 = vpaddd_avx2(auVar55,auVar35);
  auVar58 = vpsrad_avx2(auVar58,0xc);
  auVar55 = vpsrad_avx2(auVar55,0xc);
  auVar58 = vpackssdw_avx2(auVar58,auVar55);
  auVar55 = vpaddd_avx2(auVar59,auVar35);
  auVar59 = vpaddd_avx2(auVar56,auVar35);
  auVar56 = vpsrad_avx2(auVar55,0xc);
  auVar55 = vpsrad_avx2(auVar59,0xc);
  auVar55 = vpackssdw_avx2(auVar56,auVar55);
  auVar61 = vpunpcklwd_avx2(auVar47,auVar48);
  auVar59 = vpmaddwd_avx2(auVar76,auVar61);
  auVar59 = vpaddd_avx2(auVar59,auVar35);
  auVar60 = vpunpckhwd_avx2(auVar47,auVar48);
  auVar56 = vpmaddwd_avx2(auVar60,auVar76);
  auVar56 = vpaddd_avx2(auVar56,auVar35);
  auVar59 = vpsrad_avx2(auVar59,0xc);
  auVar56 = vpsrad_avx2(auVar56,0xc);
  auVar59 = vpackssdw_avx2(auVar59,auVar56);
  auVar56 = vpmaddwd_avx2(auVar61,auVar54);
  auVar60 = vpmaddwd_avx2(auVar60,auVar54);
  auVar56 = vpaddd_avx2(auVar56,auVar35);
  auVar60 = vpaddd_avx2(auVar60,auVar35);
  auVar56 = vpsrad_avx2(auVar56,0xc);
  auVar60 = vpsrad_avx2(auVar60,0xc);
  auVar56 = vpackssdw_avx2(auVar56,auVar60);
  auVar60 = vpmaddwd_avx2(auVar63,auVar76);
  auVar60 = vpaddd_avx2(auVar60,auVar35);
  auVar61 = vpmaddwd_avx2(auVar62,auVar76);
  auVar61 = vpaddd_avx2(auVar61,auVar35);
  auVar60 = vpsrad_avx2(auVar60,0xc);
  auVar61 = vpsrad_avx2(auVar61,0xc);
  auVar60 = vpackssdw_avx2(auVar60,auVar61);
  auVar61 = vpmaddwd_avx2(auVar63,auVar54);
  auVar62 = vpmaddwd_avx2(auVar62,auVar54);
  auVar61 = vpaddd_avx2(auVar61,auVar35);
  auVar62 = vpaddd_avx2(auVar62,auVar35);
  auVar61 = vpsrad_avx2(auVar61,0xc);
  auVar62 = vpsrad_avx2(auVar62,0xc);
  auVar61 = vpackssdw_avx2(auVar61,auVar62);
  auVar75._8_4_ = 0xf138f9e1;
  auVar75._0_8_ = 0xf138f9e1f138f9e1;
  auVar75._12_4_ = 0xf138f9e1;
  auVar75._16_4_ = 0xf138f9e1;
  auVar75._20_4_ = 0xf138f9e1;
  auVar75._24_4_ = 0xf138f9e1;
  auVar75._28_4_ = 0xf138f9e1;
  auVar62 = vpmaddwd_avx2(auVar72,auVar75);
  auVar62 = vpaddd_avx2(auVar62,auVar35);
  auVar63 = vpmaddwd_avx2(auVar64,auVar75);
  auVar63 = vpaddd_avx2(auVar63,auVar35);
  auVar62 = vpsrad_avx2(auVar62,0xc);
  auVar63 = vpsrad_avx2(auVar63,0xc);
  auVar62 = vpackssdw_avx2(auVar62,auVar63);
  auVar63 = vpmaddwd_avx2(auVar72,auVar76);
  auVar64 = vpmaddwd_avx2(auVar64,auVar76);
  auVar63 = vpaddd_avx2(auVar63,auVar35);
  auVar64 = vpaddd_avx2(auVar64,auVar35);
  auVar63 = vpsrad_avx2(auVar63,0xc);
  auVar64 = vpsrad_avx2(auVar64,0xc);
  auVar63 = vpackssdw_avx2(auVar63,auVar64);
  auVar34 = vpunpcklwd_avx2(auVar50,auVar51);
  auVar64 = vpmaddwd_avx2(auVar75,auVar34);
  auVar64 = vpaddd_avx2(auVar64,auVar35);
  auVar69 = vpunpckhwd_avx2(auVar50,auVar51);
  auVar72 = vpmaddwd_avx2(auVar69,auVar75);
  auVar72 = vpaddd_avx2(auVar72,auVar35);
  auVar64 = vpsrad_avx2(auVar64,0xc);
  auVar72 = vpsrad_avx2(auVar72,0xc);
  auVar64 = vpackssdw_avx2(auVar64,auVar72);
  auVar72 = vpmaddwd_avx2(auVar76,auVar34);
  auVar69 = vpmaddwd_avx2(auVar69,auVar76);
  auVar72 = vpaddd_avx2(auVar72,auVar35);
  auVar69 = vpaddd_avx2(auVar69,auVar35);
  auVar72 = vpsrad_avx2(auVar72,0xc);
  auVar69 = vpsrad_avx2(auVar69,0xc);
  auVar72 = vpackssdw_avx2(auVar72,auVar69);
  auVar69 = vpaddsw_avx2(auVar3,auVar5);
  auVar17 = vpsubsw_avx2(auVar3,auVar5);
  auVar3 = vpaddsw_avx2(auVar37,auVar36);
  auVar18 = vpsubsw_avx2(auVar36,auVar37);
  auVar5 = vpaddsw_avx2(auVar65,auVar78);
  auVar78 = vpsubsw_avx2(auVar78,auVar65);
  auVar34 = vpaddsw_avx2(auVar70,auVar39);
  auVar39 = vpsubsw_avx2(auVar39,auVar70);
  auVar1 = vpaddsw_avx2(auVar9,auVar7);
  auVar70 = vpsubsw_avx2(auVar9,auVar7);
  auVar7 = vpaddsw_avx2(auVar43,auVar45);
  auVar65 = vpsubsw_avx2(auVar45,auVar43);
  auVar9 = vpaddsw_avx2(auVar58,auVar79);
  auVar79 = vpsubsw_avx2(auVar58,auVar79);
  auVar58 = vpaddsw_avx2(auVar52,auVar66);
  auVar66 = vpsubsw_avx2(auVar52,auVar66);
  auVar52 = vpaddsw_avx2(auVar10,auVar8);
  auVar19 = vpsubsw_avx2(auVar10,auVar8);
  auVar8 = vpaddsw_avx2(auVar46,auVar44);
  auVar20 = vpsubsw_avx2(auVar46,auVar44);
  auVar10 = vpaddsw_avx2(auVar55,auVar67);
  auVar67 = vpsubsw_avx2(auVar55,auVar67);
  auVar55 = vpaddsw_avx2(auVar57,auVar68);
  auVar21 = vpsubsw_avx2(auVar57,auVar68);
  auVar68 = vpaddsw_avx2(auVar4,auVar6);
  auVar22 = vpsubsw_avx2(auVar4,auVar6);
  auVar57 = vpaddsw_avx2(auVar41,auVar42);
  auVar23 = vpsubsw_avx2(auVar41,auVar42);
  auVar4 = vpaddsw_avx2(auVar38,auVar40);
  auVar46 = vpsubsw_avx2(auVar38,auVar40);
  auVar6 = vpaddsw_avx2(auVar71,auVar74);
  auVar44 = vpsubsw_avx2(auVar71,auVar74);
  auVar73._8_4_ = 0xb50f4b0;
  auVar73._0_8_ = 0xb50f4b00b50f4b0;
  auVar73._12_4_ = 0xb50f4b0;
  auVar73._16_4_ = 0xb50f4b0;
  auVar73._20_4_ = 0xb50f4b0;
  auVar73._24_4_ = 0xb50f4b0;
  auVar73._28_4_ = 0xb50f4b0;
  auVar42 = vpunpcklwd_avx2(auVar53,auVar77);
  auVar36 = vpmaddwd_avx2(auVar73,auVar42);
  auVar36 = vpaddd_avx2(auVar36,auVar35);
  auVar37 = vpunpckhwd_avx2(auVar53,auVar77);
  auVar41 = vpmaddwd_avx2(auVar73,auVar37);
  auVar41 = vpaddd_avx2(auVar41,auVar35);
  auVar36 = vpsrad_avx2(auVar36,0xc);
  auVar41 = vpsrad_avx2(auVar41,0xc);
  auVar36 = vpackssdw_avx2(auVar36,auVar41);
  auVar49._8_4_ = 0xb500b50;
  auVar49._0_8_ = 0xb500b500b500b50;
  auVar49._12_4_ = 0xb500b50;
  auVar49._16_4_ = 0xb500b50;
  auVar49._20_4_ = 0xb500b50;
  auVar49._24_4_ = 0xb500b50;
  auVar49._28_4_ = 0xb500b50;
  auVar41 = vpmaddwd_avx2(auVar42,auVar49);
  auVar37 = vpmaddwd_avx2(auVar37,auVar49);
  auVar41 = vpaddd_avx2(auVar41,auVar35);
  auVar37 = vpaddd_avx2(auVar37,auVar35);
  auVar42 = vpsrad_avx2(auVar41,0xc);
  auVar41 = vpsrad_avx2(auVar37,0xc);
  auVar41 = vpackssdw_avx2(auVar42,auVar41);
  auVar37 = vpmaddwd_avx2(auVar73,auVar33);
  auVar37 = vpaddd_avx2(auVar37,auVar35);
  auVar42 = vpmaddwd_avx2(auVar32,auVar73);
  auVar42 = vpaddd_avx2(auVar42,auVar35);
  auVar37 = vpsrad_avx2(auVar37,0xc);
  auVar42 = vpsrad_avx2(auVar42,0xc);
  auVar37 = vpackssdw_avx2(auVar37,auVar42);
  auVar42 = vpmaddwd_avx2(auVar33,auVar49);
  auVar43 = vpmaddwd_avx2(auVar32,auVar49);
  auVar42 = vpaddd_avx2(auVar42,auVar35);
  auVar43 = vpaddd_avx2(auVar43,auVar35);
  auVar42 = vpsrad_avx2(auVar42,0xc);
  auVar43 = vpsrad_avx2(auVar43,0xc);
  auVar42 = vpackssdw_avx2(auVar42,auVar43);
  auVar32 = vpaddsw_avx2(auVar11,auVar13);
  auVar33 = vpsubsw_avx2(auVar11,auVar13);
  auVar11 = vpaddsw_avx2(auVar50,auVar47);
  auVar24 = vpsubsw_avx2(auVar47,auVar50);
  auVar13 = vpaddsw_avx2(auVar64,auVar59);
  auVar25 = vpsubsw_avx2(auVar59,auVar64);
  auVar59 = vpaddsw_avx2(auVar60,auVar62);
  auVar26 = vpsubsw_avx2(auVar60,auVar62);
  auVar60 = vpaddsw_avx2(auVar12,auVar14);
  auVar27 = vpsubsw_avx2(auVar12,auVar14);
  auVar62 = vpaddsw_avx2(auVar48,auVar51);
  auVar28 = vpsubsw_avx2(auVar48,auVar51);
  auVar64 = vpaddsw_avx2(auVar72,auVar56);
  auVar29 = vpsubsw_avx2(auVar56,auVar72);
  auVar56 = vpaddsw_avx2(auVar61,auVar63);
  auVar30 = vpsubsw_avx2(auVar61,auVar63);
  auVar47 = vpunpcklwd_avx2(auVar39,auVar44);
  auVar45 = vpunpckhwd_avx2(auVar39,auVar44);
  auVar43 = vpmaddwd_avx2(auVar76,auVar47);
  auVar43 = vpaddd_avx2(auVar43,auVar35);
  auVar44 = vpmaddwd_avx2(auVar76,auVar45);
  auVar44 = vpaddd_avx2(auVar44,auVar35);
  auVar43 = vpsrad_avx2(auVar43,0xc);
  auVar44 = vpsrad_avx2(auVar44,0xc);
  auVar43 = vpackssdw_avx2(auVar43,auVar44);
  auVar44 = vpmaddwd_avx2(auVar47,auVar54);
  auVar45 = vpmaddwd_avx2(auVar45,auVar54);
  auVar44 = vpaddd_avx2(auVar44,auVar35);
  auVar45 = vpaddd_avx2(auVar45,auVar35);
  auVar44 = vpsrad_avx2(auVar44,0xc);
  auVar45 = vpsrad_avx2(auVar45,0xc);
  auVar44 = vpackssdw_avx2(auVar44,auVar45);
  auVar48 = vpunpcklwd_avx2(auVar78,auVar46);
  auVar47 = vpunpckhwd_avx2(auVar78,auVar46);
  auVar45 = vpmaddwd_avx2(auVar76,auVar48);
  auVar45 = vpaddd_avx2(auVar45,auVar35);
  auVar46 = vpmaddwd_avx2(auVar76,auVar47);
  auVar46 = vpaddd_avx2(auVar46,auVar35);
  auVar45 = vpsrad_avx2(auVar45,0xc);
  auVar46 = vpsrad_avx2(auVar46,0xc);
  auVar45 = vpackssdw_avx2(auVar45,auVar46);
  auVar46 = vpmaddwd_avx2(auVar48,auVar54);
  auVar47 = vpmaddwd_avx2(auVar47,auVar54);
  auVar46 = vpaddd_avx2(auVar46,auVar35);
  auVar47 = vpaddd_avx2(auVar47,auVar35);
  auVar46 = vpsrad_avx2(auVar46,0xc);
  auVar47 = vpsrad_avx2(auVar47,0xc);
  auVar46 = vpackssdw_avx2(auVar46,auVar47);
  auVar51 = vpunpcklwd_avx2(auVar18,auVar23);
  auVar50 = vpunpckhwd_avx2(auVar18,auVar23);
  auVar47 = vpmaddwd_avx2(auVar76,auVar51);
  auVar47 = vpaddd_avx2(auVar47,auVar35);
  auVar48 = vpmaddwd_avx2(auVar76,auVar50);
  auVar48 = vpaddd_avx2(auVar48,auVar35);
  auVar47 = vpsrad_avx2(auVar47,0xc);
  auVar48 = vpsrad_avx2(auVar48,0xc);
  auVar47 = vpackssdw_avx2(auVar47,auVar48);
  auVar48 = vpmaddwd_avx2(auVar51,auVar54);
  auVar50 = vpmaddwd_avx2(auVar50,auVar54);
  auVar48 = vpaddd_avx2(auVar48,auVar35);
  auVar50 = vpaddd_avx2(auVar50,auVar35);
  auVar48 = vpsrad_avx2(auVar48,0xc);
  auVar50 = vpsrad_avx2(auVar50,0xc);
  auVar48 = vpackssdw_avx2(auVar48,auVar50);
  auVar78 = vpunpcklwd_avx2(auVar17,auVar22);
  auVar51 = vpunpckhwd_avx2(auVar17,auVar22);
  auVar50 = vpmaddwd_avx2(auVar76,auVar78);
  auVar78 = vpmaddwd_avx2(auVar78,auVar54);
  auVar38 = vpmaddwd_avx2(auVar51,auVar54);
  auVar51 = vpmaddwd_avx2(auVar76,auVar51);
  auVar50 = vpaddd_avx2(auVar50,auVar35);
  auVar51 = vpaddd_avx2(auVar51,auVar35);
  auVar39 = vpsrad_avx2(auVar50,0xc);
  auVar50 = vpsrad_avx2(auVar51,0xc);
  auVar50 = vpackssdw_avx2(auVar39,auVar50);
  auVar51 = vpaddd_avx2(auVar78,auVar35);
  auVar78 = vpaddd_avx2(auVar38,auVar35);
  auVar51 = vpsrad_avx2(auVar51,0xc);
  auVar78 = vpsrad_avx2(auVar78,0xc);
  auVar51 = vpackssdw_avx2(auVar51,auVar78);
  auVar71 = vpunpcklwd_avx2(auVar70,auVar19);
  auVar39 = vpunpckhwd_avx2(auVar70,auVar19);
  auVar78 = vpmaddwd_avx2(auVar75,auVar71);
  auVar78 = vpaddd_avx2(auVar78,auVar35);
  auVar38 = vpmaddwd_avx2(auVar75,auVar39);
  auVar38 = vpaddd_avx2(auVar38,auVar35);
  auVar78 = vpsrad_avx2(auVar78,0xc);
  auVar38 = vpsrad_avx2(auVar38,0xc);
  auVar78 = vpackssdw_avx2(auVar78,auVar38);
  auVar38 = vpmaddwd_avx2(auVar76,auVar71);
  auVar39 = vpmaddwd_avx2(auVar76,auVar39);
  auVar38 = vpaddd_avx2(auVar38,auVar35);
  auVar39 = vpaddd_avx2(auVar39,auVar35);
  auVar38 = vpsrad_avx2(auVar38,0xc);
  auVar39 = vpsrad_avx2(auVar39,0xc);
  auVar38 = vpackssdw_avx2(auVar38,auVar39);
  auVar74 = vpunpcklwd_avx2(auVar65,auVar20);
  auVar70 = vpunpckhwd_avx2(auVar65,auVar20);
  auVar39 = vpmaddwd_avx2(auVar75,auVar74);
  auVar39 = vpaddd_avx2(auVar39,auVar35);
  auVar71 = vpmaddwd_avx2(auVar75,auVar70);
  auVar71 = vpaddd_avx2(auVar71,auVar35);
  auVar39 = vpsrad_avx2(auVar39,0xc);
  auVar71 = vpsrad_avx2(auVar71,0xc);
  auVar39 = vpackssdw_avx2(auVar39,auVar71);
  auVar71 = vpmaddwd_avx2(auVar76,auVar74);
  auVar70 = vpmaddwd_avx2(auVar76,auVar70);
  auVar71 = vpaddd_avx2(auVar71,auVar35);
  auVar70 = vpaddd_avx2(auVar70,auVar35);
  auVar71 = vpsrad_avx2(auVar71,0xc);
  auVar70 = vpsrad_avx2(auVar70,0xc);
  auVar71 = vpackssdw_avx2(auVar71,auVar70);
  auVar40 = vpunpcklwd_avx2(auVar79,auVar67);
  auVar65 = vpunpckhwd_avx2(auVar79,auVar67);
  auVar70 = vpmaddwd_avx2(auVar75,auVar40);
  auVar70 = vpaddd_avx2(auVar70,auVar35);
  auVar74 = vpmaddwd_avx2(auVar75,auVar65);
  auVar74 = vpaddd_avx2(auVar74,auVar35);
  auVar70 = vpsrad_avx2(auVar70,0xc);
  auVar74 = vpsrad_avx2(auVar74,0xc);
  auVar70 = vpackssdw_avx2(auVar70,auVar74);
  auVar74 = vpmaddwd_avx2(auVar76,auVar40);
  auVar65 = vpmaddwd_avx2(auVar76,auVar65);
  auVar74 = vpaddd_avx2(auVar74,auVar35);
  auVar65 = vpaddd_avx2(auVar65,auVar35);
  auVar74 = vpsrad_avx2(auVar74,0xc);
  auVar65 = vpsrad_avx2(auVar65,0xc);
  auVar74 = vpackssdw_avx2(auVar74,auVar65);
  auVar79 = vpunpcklwd_avx2(auVar66,auVar21);
  auVar67 = vpunpckhwd_avx2(auVar66,auVar21);
  auVar65 = vpmaddwd_avx2(auVar75,auVar79);
  auVar40 = vpmaddwd_avx2(auVar75,auVar67);
  auVar79 = vpmaddwd_avx2(auVar76,auVar79);
  auVar67 = vpmaddwd_avx2(auVar76,auVar67);
  auVar65 = vpaddd_avx2(auVar65,auVar35);
  auVar40 = vpaddd_avx2(auVar40,auVar35);
  auVar65 = vpsrad_avx2(auVar65,0xc);
  auVar40 = vpsrad_avx2(auVar40,0xc);
  auVar65 = vpackssdw_avx2(auVar65,auVar40);
  auVar40 = vpaddd_avx2(auVar79,auVar35);
  auVar79 = vpaddd_avx2(auVar67,auVar35);
  auVar67 = vpsrad_avx2(auVar40,0xc);
  auVar40 = vpsrad_avx2(auVar79,0xc);
  auVar40 = vpackssdw_avx2(auVar67,auVar40);
  auVar79._8_2_ = 0x5a80;
  auVar79._0_8_ = 0x5a805a805a805a80;
  auVar79._10_2_ = 0x5a80;
  auVar79._12_2_ = 0x5a80;
  auVar79._14_2_ = 0x5a80;
  auVar79._16_2_ = 0x5a80;
  auVar79._18_2_ = 0x5a80;
  auVar79._20_2_ = 0x5a80;
  auVar79._22_2_ = 0x5a80;
  auVar79._24_2_ = 0x5a80;
  auVar79._26_2_ = 0x5a80;
  auVar79._28_2_ = 0x5a80;
  auVar79._30_2_ = 0x5a80;
  auVar79 = vpmulhrsw_avx2(auVar79,(undefined1  [32])*input);
  auVar61 = vpaddsw_avx2(auVar79,auVar16);
  auVar19 = vpsubsw_avx2(auVar79,auVar16);
  auVar63 = vpaddsw_avx2(auVar79,auVar77);
  auVar20 = vpsubsw_avx2(auVar79,auVar77);
  auVar72 = vpaddsw_avx2(auVar79,auVar41);
  auVar21 = vpsubsw_avx2(auVar79,auVar41);
  auVar12 = vpaddsw_avx2(auVar79,auVar42);
  auVar22 = vpsubsw_avx2(auVar79,auVar42);
  auVar14 = vpaddsw_avx2(auVar79,auVar37);
  auVar23 = vpsubsw_avx2(auVar79,auVar37);
  auVar16 = vpaddsw_avx2(auVar79,auVar36);
  auVar54 = vpsubsw_avx2(auVar79,auVar36);
  auVar17 = vpaddsw_avx2(auVar79,auVar53);
  auVar75 = vpsubsw_avx2(auVar79,auVar53);
  auVar18 = vpaddsw_avx2(auVar79,auVar15);
  auVar15 = vpsubsw_avx2(auVar79,auVar15);
  auVar42 = vpunpcklwd_avx2(auVar26,auVar30);
  auVar37 = vpunpckhwd_avx2(auVar26,auVar30);
  auVar36 = vpmaddwd_avx2(auVar73,auVar42);
  auVar36 = vpaddd_avx2(auVar36,auVar35);
  auVar41 = vpmaddwd_avx2(auVar73,auVar37);
  auVar41 = vpaddd_avx2(auVar41,auVar35);
  auVar36 = vpsrad_avx2(auVar36,0xc);
  auVar41 = vpsrad_avx2(auVar41,0xc);
  auVar36 = vpackssdw_avx2(auVar36,auVar41);
  auVar41 = vpmaddwd_avx2(auVar42,auVar49);
  auVar37 = vpmaddwd_avx2(auVar37,auVar49);
  auVar41 = vpaddd_avx2(auVar41,auVar35);
  auVar37 = vpaddd_avx2(auVar37,auVar35);
  auVar41 = vpsrad_avx2(auVar41,0xc);
  auVar37 = vpsrad_avx2(auVar37,0xc);
  auVar41 = vpackssdw_avx2(auVar41,auVar37);
  auVar77 = vpunpcklwd_avx2(auVar25,auVar29);
  auVar53 = vpunpckhwd_avx2(auVar25,auVar29);
  auVar37 = vpmaddwd_avx2(auVar73,auVar77);
  auVar37 = vpaddd_avx2(auVar37,auVar35);
  auVar42 = vpmaddwd_avx2(auVar73,auVar53);
  auVar42 = vpaddd_avx2(auVar42,auVar35);
  auVar37 = vpsrad_avx2(auVar37,0xc);
  auVar42 = vpsrad_avx2(auVar42,0xc);
  auVar37 = vpackssdw_avx2(auVar37,auVar42);
  auVar42 = vpmaddwd_avx2(auVar77,auVar49);
  auVar53 = vpmaddwd_avx2(auVar53,auVar49);
  auVar42 = vpaddd_avx2(auVar42,auVar35);
  auVar53 = vpaddd_avx2(auVar53,auVar35);
  auVar42 = vpsrad_avx2(auVar42,0xc);
  auVar53 = vpsrad_avx2(auVar53,0xc);
  auVar42 = vpackssdw_avx2(auVar42,auVar53);
  auVar67 = vpunpcklwd_avx2(auVar24,auVar28);
  auVar79 = vpunpckhwd_avx2(auVar24,auVar28);
  auVar53 = vpmaddwd_avx2(auVar73,auVar67);
  auVar53 = vpaddd_avx2(auVar53,auVar35);
  auVar77 = vpmaddwd_avx2(auVar73,auVar79);
  auVar77 = vpaddd_avx2(auVar77,auVar35);
  auVar53 = vpsrad_avx2(auVar53,0xc);
  auVar77 = vpsrad_avx2(auVar77,0xc);
  auVar53 = vpackssdw_avx2(auVar53,auVar77);
  auVar77 = vpmaddwd_avx2(auVar67,auVar49);
  auVar79 = vpmaddwd_avx2(auVar79,auVar49);
  auVar77 = vpaddd_avx2(auVar77,auVar35);
  auVar79 = vpaddd_avx2(auVar79,auVar35);
  auVar77 = vpsrad_avx2(auVar77,0xc);
  auVar79 = vpsrad_avx2(auVar79,0xc);
  auVar77 = vpackssdw_avx2(auVar77,auVar79);
  auVar24 = vpunpcklwd_avx2(auVar33,auVar27);
  auVar66 = vpunpckhwd_avx2(auVar33,auVar27);
  auVar79 = vpmaddwd_avx2(auVar73,auVar24);
  auVar79 = vpaddd_avx2(auVar79,auVar35);
  auVar67 = vpmaddwd_avx2(auVar73,auVar66);
  auVar67 = vpaddd_avx2(auVar67,auVar35);
  auVar79 = vpsrad_avx2(auVar79,0xc);
  auVar67 = vpsrad_avx2(auVar67,0xc);
  auVar79 = vpackssdw_avx2(auVar79,auVar67);
  auVar67 = vpmaddwd_avx2(auVar24,auVar49);
  auVar66 = vpmaddwd_avx2(auVar66,auVar49);
  auVar67 = vpaddd_avx2(auVar67,auVar35);
  auVar66 = vpaddd_avx2(auVar66,auVar35);
  auVar67 = vpsrad_avx2(auVar67,0xc);
  auVar66 = vpsrad_avx2(auVar66,0xc);
  auVar67 = vpackssdw_avx2(auVar67,auVar66);
  auVar66 = vpaddsw_avx2(auVar69,auVar1);
  auVar33 = vpsubsw_avx2(auVar69,auVar1);
  auVar69 = vpaddsw_avx2(auVar3,auVar7);
  auVar24 = vpsubsw_avx2(auVar3,auVar7);
  auVar3 = vpaddsw_avx2(auVar5,auVar9);
  auVar25 = vpsubsw_avx2(auVar5,auVar9);
  auVar5 = vpaddsw_avx2(auVar34,auVar58);
  auVar26 = vpsubsw_avx2(auVar34,auVar58);
  auVar58 = vpaddsw_avx2(auVar43,auVar65);
  auVar27 = vpsubsw_avx2(auVar43,auVar65);
  auVar65 = vpaddsw_avx2(auVar45,auVar70);
  auVar45 = vpsubsw_avx2(auVar45,auVar70);
  auVar70 = vpaddsw_avx2(auVar47,auVar39);
  auVar43 = vpsubsw_avx2(auVar47,auVar39);
  auVar34 = vpaddsw_avx2(auVar50,auVar78);
  auVar47 = vpsubsw_avx2(auVar50,auVar78);
  auVar1 = vpaddsw_avx2(auVar68,auVar52);
  auVar39 = vpsubsw_avx2(auVar68,auVar52);
  auVar68 = vpaddsw_avx2(auVar57,auVar8);
  auVar78 = vpsubsw_avx2(auVar57,auVar8);
  auVar52 = vpaddsw_avx2(auVar4,auVar10);
  auVar28 = vpsubsw_avx2(auVar4,auVar10);
  auVar57 = vpaddsw_avx2(auVar6,auVar55);
  auVar50 = vpsubsw_avx2(auVar6,auVar55);
  auVar55 = vpaddsw_avx2(auVar40,auVar44);
  auVar29 = vpsubsw_avx2(auVar44,auVar40);
  auVar40 = vpaddsw_avx2(auVar46,auVar74);
  auVar44 = vpsubsw_avx2(auVar46,auVar74);
  auVar74 = vpaddsw_avx2(auVar71,auVar48);
  auVar46 = vpsubsw_avx2(auVar48,auVar71);
  auVar7 = vpaddsw_avx2(auVar51,auVar38);
  auVar48 = vpsubsw_avx2(auVar51,auVar38);
  auVar9 = vpaddsw_avx2(auVar60,auVar61);
  auVar30 = vpsubsw_avx2(auVar61,auVar60);
  auVar60 = vpaddsw_avx2(auVar62,auVar63);
  auVar76 = vpsubsw_avx2(auVar63,auVar62);
  auVar61 = vpaddsw_avx2(auVar64,auVar72);
  auVar31 = vpsubsw_avx2(auVar72,auVar64);
  auVar62 = vpaddsw_avx2(auVar56,auVar12);
  auVar12 = vpsubsw_avx2(auVar12,auVar56);
  auVar56 = vpaddsw_avx2(auVar41,auVar14);
  auVar14 = vpsubsw_avx2(auVar14,auVar41);
  auVar63 = vpaddsw_avx2(auVar42,auVar16);
  auVar16 = vpsubsw_avx2(auVar16,auVar42);
  auVar64 = vpaddsw_avx2(auVar77,auVar17);
  auVar17 = vpsubsw_avx2(auVar17,auVar77);
  auVar72 = vpaddsw_avx2(auVar18,auVar67);
  auVar18 = vpsubsw_avx2(auVar18,auVar67);
  auVar67 = vpaddsw_avx2(auVar15,auVar79);
  auVar15 = vpsubsw_avx2(auVar15,auVar79);
  auVar79 = vpaddsw_avx2(auVar53,auVar75);
  auVar75 = vpsubsw_avx2(auVar75,auVar53);
  auVar8 = vpaddsw_avx2(auVar54,auVar37);
  auVar54 = vpsubsw_avx2(auVar54,auVar37);
  auVar10 = vpaddsw_avx2(auVar23,auVar36);
  auVar23 = vpsubsw_avx2(auVar23,auVar36);
  auVar4 = vpaddsw_avx2(auVar22,auVar59);
  auVar22 = vpsubsw_avx2(auVar22,auVar59);
  auVar59 = vpaddsw_avx2(auVar21,auVar13);
  auVar13 = vpsubsw_avx2(auVar21,auVar13);
  auVar6 = vpaddsw_avx2(auVar20,auVar11);
  auVar20 = vpsubsw_avx2(auVar20,auVar11);
  auVar11 = vpaddsw_avx2(auVar19,auVar32);
  auVar32 = vpsubsw_avx2(auVar19,auVar32);
  auVar42 = vpunpcklwd_avx2(auVar47,auVar48);
  auVar37 = vpunpckhwd_avx2(auVar47,auVar48);
  auVar36 = vpmaddwd_avx2(auVar73,auVar42);
  auVar36 = vpaddd_avx2(auVar36,auVar35);
  auVar41 = vpmaddwd_avx2(auVar73,auVar37);
  auVar41 = vpaddd_avx2(auVar41,auVar35);
  auVar36 = vpsrad_avx2(auVar36,0xc);
  auVar41 = vpsrad_avx2(auVar41,0xc);
  auVar36 = vpackssdw_avx2(auVar36,auVar41);
  auVar41 = vpmaddwd_avx2(auVar42,auVar49);
  auVar37 = vpmaddwd_avx2(auVar37,auVar49);
  auVar41 = vpaddd_avx2(auVar41,auVar35);
  auVar37 = vpaddd_avx2(auVar37,auVar35);
  auVar42 = vpsrad_avx2(auVar41,0xc);
  auVar41 = vpsrad_avx2(auVar37,0xc);
  auVar41 = vpackssdw_avx2(auVar42,auVar41);
  auVar47 = vpunpcklwd_avx2(auVar43,auVar46);
  auVar43 = vpunpckhwd_avx2(auVar43,auVar46);
  auVar37 = vpmaddwd_avx2(auVar73,auVar47);
  auVar37 = vpaddd_avx2(auVar37,auVar35);
  auVar42 = vpmaddwd_avx2(auVar73,auVar43);
  auVar42 = vpaddd_avx2(auVar42,auVar35);
  auVar37 = vpsrad_avx2(auVar37,0xc);
  auVar42 = vpsrad_avx2(auVar42,0xc);
  auVar37 = vpackssdw_avx2(auVar37,auVar42);
  auVar42 = vpmaddwd_avx2(auVar47,auVar49);
  auVar43 = vpmaddwd_avx2(auVar43,auVar49);
  auVar42 = vpaddd_avx2(auVar42,auVar35);
  auVar43 = vpaddd_avx2(auVar43,auVar35);
  auVar42 = vpsrad_avx2(auVar42,0xc);
  auVar43 = vpsrad_avx2(auVar43,0xc);
  auVar42 = vpackssdw_avx2(auVar42,auVar43);
  auVar46 = vpunpcklwd_avx2(auVar45,auVar44);
  auVar45 = vpunpckhwd_avx2(auVar45,auVar44);
  auVar43 = vpmaddwd_avx2(auVar73,auVar46);
  auVar43 = vpaddd_avx2(auVar43,auVar35);
  auVar44 = vpmaddwd_avx2(auVar73,auVar45);
  auVar44 = vpaddd_avx2(auVar44,auVar35);
  auVar43 = vpsrad_avx2(auVar43,0xc);
  auVar44 = vpsrad_avx2(auVar44,0xc);
  auVar43 = vpackssdw_avx2(auVar43,auVar44);
  auVar44 = vpmaddwd_avx2(auVar46,auVar49);
  auVar45 = vpmaddwd_avx2(auVar45,auVar49);
  auVar44 = vpaddd_avx2(auVar44,auVar35);
  auVar45 = vpaddd_avx2(auVar45,auVar35);
  auVar44 = vpsrad_avx2(auVar44,0xc);
  auVar45 = vpsrad_avx2(auVar45,0xc);
  auVar44 = vpackssdw_avx2(auVar44,auVar45);
  auVar48 = vpunpcklwd_avx2(auVar27,auVar29);
  auVar47 = vpunpckhwd_avx2(auVar27,auVar29);
  auVar45 = vpmaddwd_avx2(auVar73,auVar48);
  auVar45 = vpaddd_avx2(auVar45,auVar35);
  auVar46 = vpmaddwd_avx2(auVar73,auVar47);
  auVar46 = vpaddd_avx2(auVar46,auVar35);
  auVar45 = vpsrad_avx2(auVar45,0xc);
  auVar46 = vpsrad_avx2(auVar46,0xc);
  auVar45 = vpackssdw_avx2(auVar45,auVar46);
  auVar46 = vpmaddwd_avx2(auVar48,auVar49);
  auVar47 = vpmaddwd_avx2(auVar47,auVar49);
  auVar46 = vpaddd_avx2(auVar46,auVar35);
  auVar47 = vpaddd_avx2(auVar47,auVar35);
  auVar46 = vpsrad_avx2(auVar46,0xc);
  auVar47 = vpsrad_avx2(auVar47,0xc);
  auVar46 = vpackssdw_avx2(auVar46,auVar47);
  auVar51 = vpunpcklwd_avx2(auVar26,auVar50);
  auVar50 = vpunpckhwd_avx2(auVar26,auVar50);
  auVar47 = vpmaddwd_avx2(auVar73,auVar51);
  auVar47 = vpaddd_avx2(auVar47,auVar35);
  auVar48 = vpmaddwd_avx2(auVar73,auVar50);
  auVar48 = vpaddd_avx2(auVar48,auVar35);
  auVar47 = vpsrad_avx2(auVar47,0xc);
  auVar48 = vpsrad_avx2(auVar48,0xc);
  auVar47 = vpackssdw_avx2(auVar47,auVar48);
  auVar48 = vpmaddwd_avx2(auVar51,auVar49);
  auVar50 = vpmaddwd_avx2(auVar50,auVar49);
  auVar48 = vpaddd_avx2(auVar48,auVar35);
  auVar50 = vpaddd_avx2(auVar50,auVar35);
  auVar48 = vpsrad_avx2(auVar48,0xc);
  auVar50 = vpsrad_avx2(auVar50,0xc);
  auVar48 = vpackssdw_avx2(auVar48,auVar50);
  auVar77 = vpunpcklwd_avx2(auVar25,auVar28);
  auVar53 = vpunpckhwd_avx2(auVar25,auVar28);
  auVar50 = vpmaddwd_avx2(auVar73,auVar77);
  auVar50 = vpaddd_avx2(auVar50,auVar35);
  auVar51 = vpmaddwd_avx2(auVar53,auVar73);
  auVar51 = vpaddd_avx2(auVar51,auVar35);
  auVar50 = vpsrad_avx2(auVar50,0xc);
  auVar51 = vpsrad_avx2(auVar51,0xc);
  auVar50 = vpackssdw_avx2(auVar50,auVar51);
  auVar51 = vpmaddwd_avx2(auVar77,auVar49);
  auVar53 = vpmaddwd_avx2(auVar53,auVar49);
  auVar51 = vpaddd_avx2(auVar51,auVar35);
  auVar53 = vpaddd_avx2(auVar53,auVar35);
  auVar51 = vpsrad_avx2(auVar51,0xc);
  auVar53 = vpsrad_avx2(auVar53,0xc);
  auVar51 = vpackssdw_avx2(auVar51,auVar53);
  auVar38 = vpunpcklwd_avx2(auVar24,auVar78);
  auVar78 = vpunpckhwd_avx2(auVar24,auVar78);
  auVar53 = vpmaddwd_avx2(auVar38,auVar73);
  auVar53 = vpaddd_avx2(auVar53,auVar35);
  auVar77 = vpmaddwd_avx2(auVar78,auVar73);
  auVar77 = vpaddd_avx2(auVar77,auVar35);
  auVar53 = vpsrad_avx2(auVar53,0xc);
  auVar77 = vpsrad_avx2(auVar77,0xc);
  auVar53 = vpackssdw_avx2(auVar53,auVar77);
  auVar77 = vpmaddwd_avx2(auVar38,auVar49);
  auVar78 = vpmaddwd_avx2(auVar78,auVar49);
  auVar77 = vpaddd_avx2(auVar77,auVar35);
  auVar78 = vpaddd_avx2(auVar78,auVar35);
  auVar77 = vpsrad_avx2(auVar77,0xc);
  auVar78 = vpsrad_avx2(auVar78,0xc);
  auVar77 = vpackssdw_avx2(auVar77,auVar78);
  auVar19 = vpunpcklwd_avx2(auVar33,auVar39);
  auVar71 = vpunpckhwd_avx2(auVar33,auVar39);
  auVar78 = vpmaddwd_avx2(auVar19,auVar73);
  auVar38 = vpmaddwd_avx2(auVar71,auVar73);
  auVar39 = vpmaddwd_avx2(auVar19,auVar49);
  auVar71 = vpmaddwd_avx2(auVar71,auVar49);
  auVar78 = vpaddd_avx2(auVar78,auVar35);
  auVar38 = vpaddd_avx2(auVar38,auVar35);
  auVar39 = vpaddd_avx2(auVar39,auVar35);
  auVar71 = vpaddd_avx2(auVar71,auVar35);
  auVar78 = vpsrad_avx2(auVar78,0xc);
  auVar38 = vpsrad_avx2(auVar38,0xc);
  auVar78 = vpackssdw_avx2(auVar78,auVar38);
  auVar38 = vpsrad_avx2(auVar39,0xc);
  auVar39 = vpsrad_avx2(auVar71,0xc);
  auVar38 = vpackssdw_avx2(auVar38,auVar39);
  alVar2 = (__m256i)vpaddsw_avx2(auVar9,auVar1);
  *output = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar9,auVar1);
  output[0x3f] = alVar2;
  alVar2 = (__m256i)vpaddsw_avx2(auVar60,auVar68);
  output[1] = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar60,auVar68);
  output[0x3e] = alVar2;
  alVar2 = (__m256i)vpaddsw_avx2(auVar61,auVar52);
  output[2] = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar61,auVar52);
  output[0x3d] = alVar2;
  alVar2 = (__m256i)vpaddsw_avx2(auVar62,auVar57);
  output[3] = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar62,auVar57);
  output[0x3c] = alVar2;
  alVar2 = (__m256i)vpaddsw_avx2(auVar56,auVar55);
  output[4] = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar56,auVar55);
  output[0x3b] = alVar2;
  alVar2 = (__m256i)vpaddsw_avx2(auVar63,auVar40);
  output[5] = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar63,auVar40);
  output[0x3a] = alVar2;
  alVar2 = (__m256i)vpaddsw_avx2(auVar64,auVar74);
  output[6] = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar64,auVar74);
  output[0x39] = alVar2;
  alVar2 = (__m256i)vpaddsw_avx2(auVar72,auVar7);
  output[7] = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar72,auVar7);
  output[0x38] = alVar2;
  alVar2 = (__m256i)vpaddsw_avx2(auVar41,auVar67);
  output[8] = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar67,auVar41);
  output[0x37] = alVar2;
  alVar2 = (__m256i)vpaddsw_avx2(auVar42,auVar79);
  output[9] = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar79,auVar42);
  output[0x36] = alVar2;
  alVar2 = (__m256i)vpaddsw_avx2(auVar44,auVar8);
  output[10] = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar8,auVar44);
  output[0x35] = alVar2;
  alVar2 = (__m256i)vpaddsw_avx2(auVar46,auVar10);
  output[0xb] = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar10,auVar46);
  output[0x34] = alVar2;
  alVar2 = (__m256i)vpaddsw_avx2(auVar4,auVar48);
  output[0xc] = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar4,auVar48);
  output[0x33] = alVar2;
  alVar2 = (__m256i)vpaddsw_avx2(auVar51,auVar59);
  output[0xd] = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar59,auVar51);
  output[0x32] = alVar2;
  alVar2 = (__m256i)vpaddsw_avx2(auVar77,auVar6);
  output[0xe] = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar6,auVar77);
  output[0x31] = alVar2;
  alVar2 = (__m256i)vpaddsw_avx2(auVar11,auVar38);
  output[0xf] = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar11,auVar38);
  output[0x30] = alVar2;
  alVar2 = (__m256i)vpaddsw_avx2(auVar32,auVar78);
  output[0x10] = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar32,auVar78);
  output[0x2f] = alVar2;
  alVar2 = (__m256i)vpaddsw_avx2(auVar20,auVar53);
  output[0x11] = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar20,auVar53);
  output[0x2e] = alVar2;
  alVar2 = (__m256i)vpaddsw_avx2(auVar13,auVar50);
  output[0x12] = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar13,auVar50);
  output[0x2d] = alVar2;
  alVar2 = (__m256i)vpaddsw_avx2(auVar22,auVar47);
  output[0x13] = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar22,auVar47);
  output[0x2c] = alVar2;
  alVar2 = (__m256i)vpaddsw_avx2(auVar23,auVar45);
  output[0x14] = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar23,auVar45);
  output[0x2b] = alVar2;
  alVar2 = (__m256i)vpaddsw_avx2(auVar54,auVar43);
  output[0x15] = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar54,auVar43);
  output[0x2a] = alVar2;
  alVar2 = (__m256i)vpaddsw_avx2(auVar75,auVar37);
  output[0x16] = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar75,auVar37);
  output[0x29] = alVar2;
  alVar2 = (__m256i)vpaddsw_avx2(auVar15,auVar36);
  output[0x17] = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar15,auVar36);
  output[0x28] = alVar2;
  alVar2 = (__m256i)vpaddsw_avx2(auVar18,auVar34);
  output[0x18] = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar18,auVar34);
  output[0x27] = alVar2;
  alVar2 = (__m256i)vpaddsw_avx2(auVar17,auVar70);
  output[0x19] = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar17,auVar70);
  output[0x26] = alVar2;
  alVar2 = (__m256i)vpaddsw_avx2(auVar16,auVar65);
  output[0x1a] = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar16,auVar65);
  output[0x25] = alVar2;
  alVar2 = (__m256i)vpaddsw_avx2(auVar14,auVar58);
  output[0x1b] = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar14,auVar58);
  output[0x24] = alVar2;
  alVar2 = (__m256i)vpaddsw_avx2(auVar12,auVar5);
  output[0x1c] = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar12,auVar5);
  output[0x23] = alVar2;
  alVar2 = (__m256i)vpaddsw_avx2(auVar31,auVar3);
  output[0x1d] = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar31,auVar3);
  output[0x22] = alVar2;
  alVar2 = (__m256i)vpaddsw_avx2(auVar76,auVar69);
  output[0x1e] = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar76,auVar69);
  output[0x21] = alVar2;
  alVar2 = (__m256i)vpaddsw_avx2(auVar30,auVar66);
  output[0x1f] = alVar2;
  alVar2 = (__m256i)vpsubsw_avx2(auVar30,auVar66);
  output[0x20] = alVar2;
  return;
}

Assistant:

static void idct64_low8_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                             int bd, int out_shift) {
  int i, j;
  const int32_t *cospi = cospi_arr(bit);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m256i clamp_lo = _mm256_set1_epi32(-(1 << (log_range - 1)));
  const __m256i clamp_hi = _mm256_set1_epi32((1 << (log_range - 1)) - 1);

  const __m256i cospi1 = _mm256_set1_epi32(cospi[1]);
  const __m256i cospi2 = _mm256_set1_epi32(cospi[2]);
  const __m256i cospi3 = _mm256_set1_epi32(cospi[3]);
  const __m256i cospi4 = _mm256_set1_epi32(cospi[4]);
  const __m256i cospi6 = _mm256_set1_epi32(cospi[6]);
  const __m256i cospi8 = _mm256_set1_epi32(cospi[8]);
  const __m256i cospi12 = _mm256_set1_epi32(cospi[12]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospi20 = _mm256_set1_epi32(cospi[20]);
  const __m256i cospi24 = _mm256_set1_epi32(cospi[24]);
  const __m256i cospi28 = _mm256_set1_epi32(cospi[28]);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i cospi40 = _mm256_set1_epi32(cospi[40]);
  const __m256i cospi44 = _mm256_set1_epi32(cospi[44]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospi56 = _mm256_set1_epi32(cospi[56]);
  const __m256i cospi60 = _mm256_set1_epi32(cospi[60]);
  const __m256i cospim4 = _mm256_set1_epi32(-cospi[4]);
  const __m256i cospim8 = _mm256_set1_epi32(-cospi[8]);
  const __m256i cospim12 = _mm256_set1_epi32(-cospi[12]);
  const __m256i cospim16 = _mm256_set1_epi32(-cospi[16]);
  const __m256i cospim20 = _mm256_set1_epi32(-cospi[20]);
  const __m256i cospim24 = _mm256_set1_epi32(-cospi[24]);
  const __m256i cospim28 = _mm256_set1_epi32(-cospi[28]);
  const __m256i cospim32 = _mm256_set1_epi32(-cospi[32]);
  const __m256i cospim36 = _mm256_set1_epi32(-cospi[36]);
  const __m256i cospim40 = _mm256_set1_epi32(-cospi[40]);
  const __m256i cospim48 = _mm256_set1_epi32(-cospi[48]);
  const __m256i cospim52 = _mm256_set1_epi32(-cospi[52]);
  const __m256i cospim56 = _mm256_set1_epi32(-cospi[56]);
  const __m256i cospi63 = _mm256_set1_epi32(cospi[63]);
  const __m256i cospim57 = _mm256_set1_epi32(-cospi[57]);
  const __m256i cospi7 = _mm256_set1_epi32(cospi[7]);
  const __m256i cospi5 = _mm256_set1_epi32(cospi[5]);
  const __m256i cospi59 = _mm256_set1_epi32(cospi[59]);
  const __m256i cospim61 = _mm256_set1_epi32(-cospi[61]);
  const __m256i cospim58 = _mm256_set1_epi32(-cospi[58]);
  const __m256i cospi62 = _mm256_set1_epi32(cospi[62]);

  {
    __m256i u[64];

    // stage 1
    u[0] = in[0];
    u[8] = in[4];
    u[16] = in[2];
    u[24] = in[6];
    u[32] = in[1];
    u[40] = in[5];
    u[48] = in[3];
    u[56] = in[7];

    // stage 2
    u[63] = half_btf_0_avx2(&cospi1, &u[32], &rnding, bit);
    u[32] = half_btf_0_avx2(&cospi63, &u[32], &rnding, bit);
    u[39] = half_btf_0_avx2(&cospim57, &u[56], &rnding, bit);
    u[56] = half_btf_0_avx2(&cospi7, &u[56], &rnding, bit);
    u[55] = half_btf_0_avx2(&cospi5, &u[40], &rnding, bit);
    u[40] = half_btf_0_avx2(&cospi59, &u[40], &rnding, bit);
    u[47] = half_btf_0_avx2(&cospim61, &u[48], &rnding, bit);
    u[48] = half_btf_0_avx2(&cospi3, &u[48], &rnding, bit);

    // stage 3
    u[31] = half_btf_0_avx2(&cospi2, &u[16], &rnding, bit);
    u[16] = half_btf_0_avx2(&cospi62, &u[16], &rnding, bit);
    u[23] = half_btf_0_avx2(&cospim58, &u[24], &rnding, bit);
    u[24] = half_btf_0_avx2(&cospi6, &u[24], &rnding, bit);
    u[33] = u[32];
    u[38] = u[39];
    u[41] = u[40];
    u[46] = u[47];
    u[49] = u[48];
    u[54] = u[55];
    u[57] = u[56];
    u[62] = u[63];

    // stage 4
    __m256i temp1, temp2;
    u[15] = half_btf_0_avx2(&cospi4, &u[8], &rnding, bit);
    u[8] = half_btf_0_avx2(&cospi60, &u[8], &rnding, bit);
    u[17] = u[16];
    u[22] = u[23];
    u[25] = u[24];
    u[30] = u[31];

    temp1 = half_btf_avx2(&cospim4, &u[33], &cospi60, &u[62], &rnding, bit);
    u[62] = half_btf_avx2(&cospi60, &u[33], &cospi4, &u[62], &rnding, bit);
    u[33] = temp1;

    temp2 = half_btf_avx2(&cospim36, &u[38], &cospi28, &u[57], &rnding, bit);
    u[38] = half_btf_avx2(&cospim28, &u[38], &cospim36, &u[57], &rnding, bit);
    u[57] = temp2;

    temp1 = half_btf_avx2(&cospim20, &u[41], &cospi44, &u[54], &rnding, bit);
    u[54] = half_btf_avx2(&cospi44, &u[41], &cospi20, &u[54], &rnding, bit);
    u[41] = temp1;

    temp2 = half_btf_avx2(&cospim12, &u[46], &cospim52, &u[49], &rnding, bit);
    u[49] = half_btf_avx2(&cospim52, &u[46], &cospi12, &u[49], &rnding, bit);
    u[46] = temp2;

    // stage 5
    u[9] = u[8];
    u[14] = u[15];

    temp1 = half_btf_avx2(&cospim8, &u[17], &cospi56, &u[30], &rnding, bit);
    u[30] = half_btf_avx2(&cospi56, &u[17], &cospi8, &u[30], &rnding, bit);
    u[17] = temp1;

    temp2 = half_btf_avx2(&cospim24, &u[22], &cospim40, &u[25], &rnding, bit);
    u[25] = half_btf_avx2(&cospim40, &u[22], &cospi24, &u[25], &rnding, bit);
    u[22] = temp2;

    u[35] = u[32];
    u[34] = u[33];
    u[36] = u[39];
    u[37] = u[38];
    u[43] = u[40];
    u[42] = u[41];
    u[44] = u[47];
    u[45] = u[46];
    u[51] = u[48];
    u[50] = u[49];
    u[52] = u[55];
    u[53] = u[54];
    u[59] = u[56];
    u[58] = u[57];
    u[60] = u[63];
    u[61] = u[62];

    // stage 6
    temp1 = half_btf_0_avx2(&cospi32, &u[0], &rnding, bit);
    u[1] = half_btf_0_avx2(&cospi32, &u[0], &rnding, bit);
    u[0] = temp1;

    temp2 = half_btf_avx2(&cospim16, &u[9], &cospi48, &u[14], &rnding, bit);
    u[14] = half_btf_avx2(&cospi48, &u[9], &cospi16, &u[14], &rnding, bit);
    u[9] = temp2;
    u[19] = u[16];
    u[18] = u[17];
    u[20] = u[23];
    u[21] = u[22];
    u[27] = u[24];
    u[26] = u[25];
    u[28] = u[31];
    u[29] = u[30];

    temp1 = half_btf_avx2(&cospim8, &u[34], &cospi56, &u[61], &rnding, bit);
    u[61] = half_btf_avx2(&cospi56, &u[34], &cospi8, &u[61], &rnding, bit);
    u[34] = temp1;
    temp2 = half_btf_avx2(&cospim8, &u[35], &cospi56, &u[60], &rnding, bit);
    u[60] = half_btf_avx2(&cospi56, &u[35], &cospi8, &u[60], &rnding, bit);
    u[35] = temp2;
    temp1 = half_btf_avx2(&cospim56, &u[36], &cospim8, &u[59], &rnding, bit);
    u[59] = half_btf_avx2(&cospim8, &u[36], &cospi56, &u[59], &rnding, bit);
    u[36] = temp1;
    temp2 = half_btf_avx2(&cospim56, &u[37], &cospim8, &u[58], &rnding, bit);
    u[58] = half_btf_avx2(&cospim8, &u[37], &cospi56, &u[58], &rnding, bit);
    u[37] = temp2;
    temp1 = half_btf_avx2(&cospim40, &u[42], &cospi24, &u[53], &rnding, bit);
    u[53] = half_btf_avx2(&cospi24, &u[42], &cospi40, &u[53], &rnding, bit);
    u[42] = temp1;
    temp2 = half_btf_avx2(&cospim40, &u[43], &cospi24, &u[52], &rnding, bit);
    u[52] = half_btf_avx2(&cospi24, &u[43], &cospi40, &u[52], &rnding, bit);
    u[43] = temp2;
    temp1 = half_btf_avx2(&cospim24, &u[44], &cospim40, &u[51], &rnding, bit);
    u[51] = half_btf_avx2(&cospim40, &u[44], &cospi24, &u[51], &rnding, bit);
    u[44] = temp1;
    temp2 = half_btf_avx2(&cospim24, &u[45], &cospim40, &u[50], &rnding, bit);
    u[50] = half_btf_avx2(&cospim40, &u[45], &cospi24, &u[50], &rnding, bit);
    u[45] = temp2;

    // stage 7
    u[3] = u[0];
    u[2] = u[1];
    u[11] = u[8];
    u[10] = u[9];
    u[12] = u[15];
    u[13] = u[14];

    temp1 = half_btf_avx2(&cospim16, &u[18], &cospi48, &u[29], &rnding, bit);
    u[29] = half_btf_avx2(&cospi48, &u[18], &cospi16, &u[29], &rnding, bit);
    u[18] = temp1;
    temp2 = half_btf_avx2(&cospim16, &u[19], &cospi48, &u[28], &rnding, bit);
    u[28] = half_btf_avx2(&cospi48, &u[19], &cospi16, &u[28], &rnding, bit);
    u[19] = temp2;
    temp1 = half_btf_avx2(&cospim48, &u[20], &cospim16, &u[27], &rnding, bit);
    u[27] = half_btf_avx2(&cospim16, &u[20], &cospi48, &u[27], &rnding, bit);
    u[20] = temp1;
    temp2 = half_btf_avx2(&cospim48, &u[21], &cospim16, &u[26], &rnding, bit);
    u[26] = half_btf_avx2(&cospim16, &u[21], &cospi48, &u[26], &rnding, bit);
    u[21] = temp2;
    for (i = 32; i < 64; i += 16) {
      for (j = i; j < i + 4; j++) {
        addsub_avx2(u[j], u[j ^ 7], &u[j], &u[j ^ 7], &clamp_lo, &clamp_hi);
        addsub_avx2(u[j ^ 15], u[j ^ 8], &u[j ^ 15], &u[j ^ 8], &clamp_lo,
                    &clamp_hi);
      }
    }

    // stage 8
    u[7] = u[0];
    u[6] = u[1];
    u[5] = u[2];
    u[4] = u[3];

    idct64_stage8_avx2(u, &cospim32, &cospi32, &cospim16, &cospi48, &cospi16,
                       &cospim48, &clamp_lo, &clamp_hi, &rnding, bit);

    // stage 9
    idct64_stage9_avx2(u, &cospim32, &cospi32, &clamp_lo, &clamp_hi, &rnding,
                       bit);

    // stage 10
    idct64_stage10_avx2(u, &cospim32, &cospi32, &clamp_lo, &clamp_hi, &rnding,
                        bit);

    // stage 11
    idct64_stage11_avx2(u, out, do_cols, bd, out_shift, &clamp_lo, &clamp_hi);
  }
}